

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginDockableDragDropSource(ImGuiWindow *window)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiContext *g;
  ImGuiWindow *in_RDI;
  ImGuiWindow *local_8;
  
  pIVar4 = GImGui;
  if (GImGui->ActiveId != in_RDI->MoveId) {
    __assert_fail("g.ActiveId == window->MoveId",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x39f8,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  if (GImGui->MovingWindow == in_RDI) {
    (in_RDI->DC).LastItemId = in_RDI->MoveId;
    local_8 = in_RDI->RootWindow;
    if ((local_8->Flags & 0x200000) == 0) {
      if ((((pIVar4->IO).ConfigDockingWithShift != false) ||
          ((((fVar1 = (pIVar4->ActiveIdClickOffset).x, 0.0 <= fVar1 &&
             (fVar2 = (pIVar4->Style).FramePadding.y, fVar3 = (pIVar4->ActiveIdClickOffset).y,
             fVar3 < fVar2 + fVar2 + pIVar4->FontSize)) && (0.0 <= fVar3)) &&
           (fVar1 < (local_8->SizeFull).x)))) && (bVar5 = BeginDragDropSource(0x25), bVar5)) {
        SetDragDropPayload("_IMWINDOW",&local_8,8,0);
        EndDragDropSource();
      }
      return;
    }
    __assert_fail("(window->Flags & ImGuiWindowFlags_NoDocking) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                  ,0x39fd,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
  }
  __assert_fail("g.MovingWindow == window",
                "/workspace/llm4binary/github/license_c_cmakelists/dfranx[P]PluginShadertoy/libs/imgui/imgui.cpp"
                ,0x39f9,"void ImGui::BeginDockableDragDropSource(ImGuiWindow *)");
}

Assistant:

void ImGui::BeginDockableDragDropSource(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.ActiveId == window->MoveId);
    IM_ASSERT(g.MovingWindow == window);

    window->DC.LastItemId = window->MoveId;
    window = window->RootWindow;
    IM_ASSERT((window->Flags & ImGuiWindowFlags_NoDocking) == 0);
    bool is_drag_docking = (g.IO.ConfigDockingWithShift) || ImRect(0, 0, window->SizeFull.x, GetFrameHeight()).Contains(g.ActiveIdClickOffset);
    if (is_drag_docking && BeginDragDropSource(ImGuiDragDropFlags_SourceNoPreviewTooltip | ImGuiDragDropFlags_SourceNoHoldToOpenOthers | ImGuiDragDropFlags_SourceAutoExpirePayload))
    {
        SetDragDropPayload(IMGUI_PAYLOAD_TYPE_WINDOW, &window, sizeof(window));
        EndDragDropSource();
    }
}